

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase::sectionStarting
          (CumulativeReporterBase *this,SectionInfo *sectionInfo)

{
  __normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  __last;
  bool bVar1;
  undefined1 uVar2;
  SectionNode *p;
  reference this_00;
  SectionInfo *in_RSI;
  __normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  in_RDI;
  const_iterator it;
  SectionNode *parentNode;
  Ptr<Catch::CumulativeReporterBase::SectionNode> node;
  SectionStats incompleteStats;
  vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  *in_stack_fffffffffffffea8;
  vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  *in_stack_fffffffffffffeb0;
  __normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  in_stack_fffffffffffffeb8;
  SectionNode *in_stack_fffffffffffffec0;
  SectionNode *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  BySectionInfo local_108;
  Ptr<Catch::CumulativeReporterBase::SectionNode> *local_100;
  Ptr<Catch::CumulativeReporterBase::SectionNode> *local_f8;
  Ptr<Catch::CumulativeReporterBase::SectionNode> *local_f0;
  __normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  local_e8;
  SectionNode *local_e0;
  Ptr<Catch::CumulativeReporterBase::SectionNode> local_c8;
  Counts local_c0 [7];
  SectionInfo *local_10;
  
  local_10 = in_RSI;
  Counts::Counts(local_c0);
  SectionStats::SectionStats
            ((SectionStats *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             (SectionInfo *)in_stack_fffffffffffffec8,(Counts *)in_stack_fffffffffffffec0,
             (double)in_stack_fffffffffffffeb8._M_current,
             SUB81((ulong)in_stack_fffffffffffffeb0 >> 0x38,0));
  Ptr<Catch::CumulativeReporterBase::SectionNode>::Ptr(&local_c8);
  bVar1 = std::
          vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
          ::empty((vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                   *)in_stack_fffffffffffffec0);
  if (bVar1) {
    uVar2 = Ptr<Catch::CumulativeReporterBase::SectionNode>::operator!(in_RDI._M_current + 0x13);
    if ((bool)uVar2) {
      p = (SectionNode *)operator_new(0x118);
      SectionNode::SectionNode
                (in_stack_fffffffffffffec0,(SectionStats *)in_stack_fffffffffffffeb8._M_current);
      Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=
                ((Ptr<Catch::CumulativeReporterBase::SectionNode> *)
                 CONCAT17(uVar2,in_stack_fffffffffffffed0),p);
    }
    Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=
              ((Ptr<Catch::CumulativeReporterBase::SectionNode> *)in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8._M_current);
  }
  else {
    this_00 = std::
              vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
              ::back(in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffec0 = Ptr<Catch::CumulativeReporterBase::SectionNode>::operator*(this_00);
    local_e0 = in_stack_fffffffffffffec0;
    local_f8 = (Ptr<Catch::CumulativeReporterBase::SectionNode> *)
               std::
               vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
               ::begin(in_stack_fffffffffffffea8);
    local_100 = (Ptr<Catch::CumulativeReporterBase::SectionNode> *)
                std::
                vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                ::end(in_stack_fffffffffffffea8);
    BySectionInfo::BySectionInfo(&local_108,local_10);
    __last._M_current._7_1_ = in_stack_fffffffffffffed7;
    __last._M_current._0_7_ = in_stack_fffffffffffffed0;
    in_stack_fffffffffffffeb8 =
         std::
         find_if<__gnu_cxx::__normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>*,std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>>>>,Catch::CumulativeReporterBase::BySectionInfo>
                   (in_RDI,__last,(BySectionInfo *)in_stack_fffffffffffffec8);
    local_f0 = (Ptr<Catch::CumulativeReporterBase::SectionNode> *)in_stack_fffffffffffffeb8;
    __gnu_cxx::
    __normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>const*,std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>>>>
    ::__normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>*>
              ((__normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
                *)in_stack_fffffffffffffeb0,
               (__normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
                *)in_stack_fffffffffffffea8);
    std::
    vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
    ::end(in_stack_fffffffffffffea8);
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
                        *)in_stack_fffffffffffffeb0,
                       (__normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
                        *)in_stack_fffffffffffffea8);
    if (bVar1) {
      in_stack_fffffffffffffeb0 =
           (vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
            *)operator_new(0x118);
      SectionNode::SectionNode
                (in_stack_fffffffffffffec0,(SectionStats *)in_stack_fffffffffffffeb8._M_current);
      Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=
                ((Ptr<Catch::CumulativeReporterBase::SectionNode> *)
                 CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffec8);
      std::
      vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ::push_back((vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                   *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8._M_current);
    }
    else {
      __gnu_cxx::
      __normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
      ::operator*(&local_e8);
      Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=
                ((Ptr<Catch::CumulativeReporterBase::SectionNode> *)in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffeb8._M_current);
    }
  }
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ::push_back((vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
               *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8._M_current);
  Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=
            ((Ptr<Catch::CumulativeReporterBase::SectionNode> *)in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8._M_current);
  Ptr<Catch::CumulativeReporterBase::SectionNode>::~Ptr
            ((Ptr<Catch::CumulativeReporterBase::SectionNode> *)in_stack_fffffffffffffeb0);
  SectionStats::~SectionStats((SectionStats *)0x18969f);
  return;
}

Assistant:

virtual void sectionStarting( SectionInfo const& sectionInfo ) CATCH_OVERRIDE {
            SectionStats incompleteStats( sectionInfo, Counts(), 0, false );
            Ptr<SectionNode> node;
            if( m_sectionStack.empty() ) {
                if( !m_rootSection )
                    m_rootSection = new SectionNode( incompleteStats );
                node = m_rootSection;
            }
            else {
                SectionNode& parentNode = *m_sectionStack.back();
                SectionNode::ChildSections::const_iterator it =
                    std::find_if(   parentNode.childSections.begin(),
                                    parentNode.childSections.end(),
                                    BySectionInfo( sectionInfo ) );
                if( it == parentNode.childSections.end() ) {
                    node = new SectionNode( incompleteStats );
                    parentNode.childSections.push_back( node );
                }
                else
                    node = *it;
            }
            m_sectionStack.push_back( node );
            m_deepestSection = node;
        }